

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_produce_args(writer *w,method_signature *method_signature)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  bool bVar2;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *this;
  reference __in;
  type *this_00;
  type *ppPVar3;
  TypeSig *pTVar4;
  value_type *args;
  void *__buf;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  ParamAttributes local_e6;
  param_category local_e4;
  undefined1 local_e0 [4];
  param_category category;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0 [2];
  ParamAttributes local_9a;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined1 local_88 [8];
  string param_type;
  string_view param_name;
  type *param_signature;
  type *param;
  __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
  local_40;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *__range1;
  separator s;
  method_signature *method_signature_local;
  writer *w_local;
  
  s.w._0_1_ = 1;
  __range1 = (vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              *)w;
  s._8_8_ = method_signature;
  this = cppwinrt::method_signature::params(method_signature);
  __end1 = std::
           vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ::begin(this);
  local_40._M_current =
       (pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*> *)
       std::
       vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
       ::end(this);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&local_40), bVar2) {
    __in = __gnu_cxx::
           __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
           ::operator*(&__end1);
    this_00 = ::std::get<0ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    ppPVar3 = ::std::get<1ul,winmd::reader::Param,winmd::reader::ParamSig_const*>(__in);
    separator::operator()((separator *)&__range1);
    join_0x00000010_0x00000000_ = winmd::reader::Param::Name(this_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"%");
    pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
    args = winmd::reader::TypeSig::Type(pTVar4);
    writer_base<cppwinrt::writer>::
    write_temp<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>>
              ((string *)local_88,&w->super_writer_base<cppwinrt::writer>,&local_98,args);
    pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
    bVar2 = winmd::reader::TypeSig::is_szarray(pTVar4);
    if (bVar2) {
      local_9a = winmd::reader::Param::Flags(this_00);
      bVar2 = winmd::reader::ParamAttributes::In(&local_9a);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_c0,
                   "array_view<@ const>(reinterpret_cast<@ const *>(%), reinterpret_cast<@ const *>(%) + __%Size)"
                  );
        pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&param_type.field_2 + 8)
        ;
        writer_base<cppwinrt::writer>::
        write<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  (&w->super_writer_base<cppwinrt::writer>,local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_88,pbVar1,pbVar1);
      }
      else {
        bVar2 = winmd::reader::ParamSig::ByRef(*ppPVar3);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d0,"detach_abi<@>(__%Size, %)");
          pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&param_type.field_2 + 8);
          writer_base<cppwinrt::writer>::
          write<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     pbVar1,pbVar1);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_e0,
                     "array_view<@>(reinterpret_cast<@*>(%), reinterpret_cast<@*>(%) + __%Size)");
          pbVar1 = (basic_string_view<char,_std::char_traits<char>_> *)
                   ((long)&param_type.field_2 + 8);
          writer_base<cppwinrt::writer>::
          write<std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     pbVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,pbVar1,pbVar1);
        }
      }
    }
    else {
      pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
      local_e4 = get_category(pTVar4,(TypeDef *)0x0);
      local_e6 = winmd::reader::Param::Flags(this_00);
      bVar2 = winmd::reader::ParamAttributes::In(&local_e6);
      if (bVar2) {
        if (local_e4 == fundamental_type) {
          writer_base<cppwinrt::writer>::write
                    (&w->super_writer_base<cppwinrt::writer>,(int)&param_type + 0x18,__buf,
                     (size_t)args);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_f8,"*reinterpret_cast<% const*>(&%)");
          writer_base<cppwinrt::writer>::
          write<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&param_type.field_2 + 8));
        }
      }
      else {
        pTVar4 = winmd::reader::ParamSig::Type(*ppPVar3);
        bVar2 = is_object(pTVar4);
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_108,"winrt_impl_%");
          writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_108,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&param_type.field_2 + 8));
        }
        else if (local_e4 == fundamental_type) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_128,"*%");
          writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_128,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&param_type.field_2 + 8));
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_118,"*reinterpret_cast<@*>(%)");
          writer_base<cppwinrt::writer>::
          write<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&param_type.field_2 + 8));
        }
      }
    }
    ::std::__cxx11::string::~string((string *)local_88);
    __gnu_cxx::
    __normal_iterator<const_std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_*,_std::vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void write_produce_args(writer& w, method_signature const& method_signature)
    {
        separator s{ w };

        for (auto&& [param, param_signature] : method_signature.params())
        {
            s();
            auto param_name = param.Name();
            auto param_type = w.write_temp("%", param_signature->Type().Type());

            if (param_signature->Type().is_szarray())
            {
                if (param.Flags().In())
                {
                    w.write("array_view<@ const>(reinterpret_cast<@ const *>(%), reinterpret_cast<@ const *>(%) + __%Size)",
                        param_type,
                        param_type,
                        param_name,
                        param_type,
                        param_name,
                        param_name);
                }
                else if (param_signature->ByRef())
                {
                    w.write("detach_abi<@>(__%Size, %)",
                        param_type,
                        param_name,
                        param_name);
                }
                else
                {
                    w.write("array_view<@>(reinterpret_cast<@*>(%), reinterpret_cast<@*>(%) + __%Size)",
                        param_type,
                        param_type,
                        param_name,
                        param_type,
                        param_name,
                        param_name);
                }
            }
            else
            {
                auto category = get_category(param_signature->Type());

                if (param.Flags().In())
                {
                    if (category != param_category::fundamental_type)
                    {
                        w.write("*reinterpret_cast<% const*>(&%)",
                            param_type,
                            param_name);
                    }
                    else
                    {
                        w.write(param_name);
                    }
                }
                else
                {
                    if (is_object(param_signature->Type()))
                    {
                        w.write("winrt_impl_%", param_name);
                    }
                    else if (category != param_category::fundamental_type)
                    {
                        w.write("*reinterpret_cast<@*>(%)",
                            param_type,
                            param_name);
                    }
                    else
                    {
                        w.write("*%", param_name);
                    }
                }
            }
        }
    }